

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O2

void tEcJobTask(void *pvThreadParamDesc)

{
  CAtEmLogging *pCVar1;
  byte bVar2;
  int iVar3;
  EC_T_DWORD EVar4;
  undefined8 uVar5;
  EC_T_BYTE *pbySrc;
  EC_T_BYTE *pbySrc_00;
  ulong uVar6;
  uint uVar7;
  ushort uVar8;
  char *szFormat;
  byte local_49;
  ulong local_48;
  EC_T_BOOL bPrevCycProcessed;
  EC_T_CHAR *pszLog;
  
  bPrevCycProcessed = 0;
  iVar3 = OsSetThreadAffinity(0,1 << (*(byte *)((long)pvThreadParamDesc + 0x18) & 0x1f));
  if (iVar3 != 0) {
    *(undefined4 *)((long)pvThreadParamDesc + 4) = 1;
    local_48 = 0;
    do {
      OsWaitForEvent(*(undefined8 *)((long)pvThreadParamDesc + 0x10),0xffffffffffffffff);
      ecatPerfMeasEnd(&S_TscMeasDesc,4);
      ecatPerfMeasStart(&S_TscMeasDesc,4);
      ecatPerfMeasStart(&S_TscMeasDesc,0);
      EVar4 = ecatExecJob(eUsrJob_ProcessAllRxFrames,&bPrevCycProcessed);
      pCVar1 = S_poLog;
      if (((EVar4 != 0x9811000e) && (EVar4 != 0x9811002d)) && (EVar4 != 0)) {
        uVar5 = ecatGetText(EVar4);
        CAtEmLogging::LogError
                  (pCVar1,"ERROR: ecatExecJob( eUsrJob_ProcessAllRxFrames): %s (0x%lx)",uVar5,
                   (ulong)EVar4);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,0);
      if (EVar4 == 0) {
        iVar3 = (int)local_48;
        if (bPrevCycProcessed == 0) {
          if (iVar3 < 0x28) {
            szFormat = 
            "eUsrJob_ProcessAllRxFrames - not all previously sent frames are received/processed (frame loss)!"
            ;
          }
          else {
            szFormat = "Error: System overload: Cycle time too short or huge jitter!";
          }
          CAtEmLogging::LogError(S_poLog,szFormat);
          local_48 = (ulong)(iVar3 + 10);
        }
        else {
          local_48 = (ulong)(iVar3 - (uint)(0 < iVar3));
        }
      }
      ecatPerfMeasStart(&S_TscMeasDesc,6);
      pszLog = (EC_T_CHAR *)0x0;
      emDcmGetLog(0,&pszLog);
      if (pszLog != (EC_T_CHAR *)0x0) {
        CAtEmLogging::LogDcm(S_poLog,pszLog);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,6);
      ecatPerfMeasStart(&S_TscMeasDesc,5);
      iVar3 = *(int *)(*(long *)((long)pvThreadParamDesc + 0x28) + 0x7738);
      pbySrc = (EC_T_BYTE *)emGetProcessImageInputPtr(0);
      pbySrc_00 = (EC_T_BYTE *)emGetProcessImageOutputPtr(0);
      local_49 = 0;
      if (callbackFct == (_func_void_EC_T_BYTE_ptr_EC_T_BYTE_ptr *)0x0) {
        CAtEmLogging::LogError(S_poLog,"callbackFct is not defined");
      }
      else {
        (*callbackFct)(pbySrc,pbySrc_00);
      }
      myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_dwWorkpdCnt =
           myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_dwWorkpdCnt + 1;
      if (myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_dwWorkpdCnt % 100 == 0) {
        uVar6 = (ulong)S_dwSlaveIdx14;
        if (pbySrc != (EC_T_BYTE *)0x0 && uVar6 != 0xffff) {
          if (S_aSlaveList[uVar6].dwPdOffsIn != 0xffffffff) {
            EC_COPYBITS_INLINE(&local_49,0,pbySrc,S_aSlaveList[uVar6].dwPdOffsIn,
                               S_aSlaveList[uVar6].dwPdSizeIn);
            bVar2 = local_49;
            if (3 < iVar3 &&
                local_49 !=
                myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_byDigInputLastVal) {
              CAtEmLogging::LogMsg
                        (S_poLog,"Input Value updated : Old : 0x%x -> New : 0x%x",
                         (ulong)myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::
                                s_byDigInputLastVal,(ulong)local_49);
              myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_byDigInputLastVal =
                   bVar2;
            }
          }
        }
        uVar6 = (ulong)S_dwSlaveIdx24;
        if (pbySrc_00 != (EC_T_BYTE *)0x0 && uVar6 != 0xffff) {
          if (S_aSlaveList[uVar6].dwPdOffsOut != 0xffffffff) {
            EC_COPYBITS_INLINE(&local_49,0,pbySrc_00,S_aSlaveList[uVar6].dwPdOffsOut,
                               S_aSlaveList[uVar6].dwPdSizeOut);
            local_49 = local_49 + 1;
            EC_COPYBITS_INLINE(pbySrc_00,S_aSlaveList[uVar6].dwPdOffsOut,&local_49,0,
                               S_aSlaveList[uVar6].dwPdSizeOut);
          }
        }
        if ((ulong)S_dwSlaveIdx4132 != 0xffff && pbySrc_00 != (EC_T_BYTE *)0x0) {
          uVar7 = S_aSlaveList[S_dwSlaveIdx4132].dwPdOffsOut;
          if (uVar7 != 0xffffffff) {
            *(short *)(pbySrc_00 + (uVar7 >> 3)) = *(short *)(pbySrc_00 + (uVar7 >> 3)) + 1;
            *(short *)(pbySrc_00 + (uVar7 + 0x10 >> 3)) =
                 *(short *)(pbySrc_00 + (uVar7 + 0x10 >> 3)) + -1;
          }
        }
        uVar6 = (ulong)S_dwSlaveIdxETCio100;
        if (uVar6 != 0xffff && pbySrc_00 != (EC_T_BYTE *)0x0) {
          if (S_aSlaveList[uVar6].dwPdOffsOut != 0xffffffff) {
            pbySrc_00[S_aSlaveList[uVar6].dwPdOffsOut >> 3] =
                 pbySrc_00[S_aSlaveList[uVar6].dwPdOffsOut >> 3] + '\x01';
            EVar4 = S_aSlaveList[uVar6].dwPdOffsOut;
            if (EVar4 != 0xffffffff) {
              uVar7 = EVar4 + 8 >> 3;
              uVar8 = *(short *)(pbySrc_00 + uVar7) + 0x100U;
              if (0xfff < (ushort)(*(short *)(pbySrc_00 + uVar7) + 0x100U)) {
                uVar8 = 0;
              }
              *(ushort *)(pbySrc_00 + uVar7) = uVar8;
              uVar7 = EVar4 + 0x18 >> 3;
              uVar8 = *(short *)(pbySrc_00 + uVar7) - 0x100;
              if (0xfff < uVar8) {
                uVar8 = 0xf00;
              }
              *(ushort *)(pbySrc_00 + uVar7) = uVar8;
            }
          }
        }
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,5);
      ecatPerfMeasStart(&S_TscMeasDesc);
      EVar4 = ecatExecJob(eUsrJob_SendAllCycFrames,(EC_T_PVOID)0x0);
      pCVar1 = S_poLog;
      if (((EVar4 != 0x9811000e) && (EVar4 != 0x9811002d)) && (EVar4 != 0)) {
        uVar5 = ecatGetText(EVar4);
        CAtEmLogging::LogError
                  (pCVar1,"ecatExecJob( eUsrJob_SendAllCycFrames,    EC_NULL ): %s (0x%lx)",uVar5,
                   (ulong)EVar4);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,1);
      if (EVar4 == 0x98110038) {
        bRun = 0;
      }
      ecatPerfMeasStart(&S_TscMeasDesc);
      EVar4 = ecatExecJob(eUsrJob_MasterTimer,(EC_T_PVOID)0x0);
      pCVar1 = S_poLog;
      if ((EVar4 != 0x9811000e) && (EVar4 != 0)) {
        uVar5 = ecatGetText(EVar4);
        CAtEmLogging::LogError
                  (pCVar1,"ecatExecJob(eUsrJob_MasterTimer, EC_NULL): %s (0x%lx)",uVar5,(ulong)EVar4
                  );
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,2);
      ecatPerfMeasStart(&S_TscMeasDesc);
      EVar4 = ecatExecJob(eUsrJob_SendAcycFrames,(EC_T_PVOID)0x0);
      pCVar1 = S_poLog;
      if (((EVar4 != 0x9811000e) && (EVar4 != 0x9811002d)) && (EVar4 != 0)) {
        uVar5 = ecatGetText(EVar4);
        CAtEmLogging::LogError
                  (pCVar1,"ecatExecJob(eUsrJob_SendAcycFrames, EC_NULL): %s (0x%lx)",uVar5,
                   (ulong)EVar4);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,3);
    } while (*(int *)((long)pvThreadParamDesc + 8) == 0);
    ecatPerfMeasShow(&S_TscMeasDesc,0xffffffffffffffff,S_aszMeasInfo);
    *(undefined4 *)((long)pvThreadParamDesc + 4) = 0;
    return;
  }
  CAtEmLogging::LogError
            (S_poLog,"Error: Set job task affinitiy, invalid CPU index %d\n",
             (ulong)*(uint *)((long)pvThreadParamDesc + 0x18));
  return;
}

Assistant:

static EC_T_VOID tEcJobTask(EC_T_VOID* pvThreadParamDesc)
{
    EC_T_DWORD           dwRes             = EC_E_ERROR;
    T_DEMO_THREAD_PARAM* pDemoThreadParam  = (T_DEMO_THREAD_PARAM*)pvThreadParamDesc;
    EC_T_CPUSET          CpuSet;
    EC_T_BOOL            bPrevCycProcessed = EC_FALSE;
    EC_T_INT             nOverloadCounter  = 0;               /* counter to check if cycle time is to short */
    EC_T_BOOL            bOk;

    EC_CPUSET_ZERO(CpuSet);
    EC_CPUSET_SET(CpuSet, pDemoThreadParam->dwCpuIndex);
    bOk = OsSetThreadAffinity(EC_NULL, CpuSet);
    if (!bOk)
    {
        LogError("Error: Set job task affinitiy, invalid CPU index %d\n", pDemoThreadParam->dwCpuIndex);
        goto Exit;
    }

    /* Start periodic task right before where it is used,
     * otherwise, OsSleepTillTick() might fail if this thread is suspended before being able to call OsMakeThreadPeriodic() */
#if (defined XENOMAI)
    OsMakeThreadPeriodic(rt_task_self(), pDemoThreadParam->dwBusCycleTimeUsec);
#endif

    /* demo loop */
    pDemoThreadParam->bJobThreadRunning = EC_TRUE;
    do
    {
        /* wait for next cycle (event from scheduler task) */
#if (defined RTAI) || (defined XENOMAI)
        OsSleepTillTick(); /* period is set after creating jobtask */
#else
        OsWaitForEvent(pDemoThreadParam->pvTimingEvent, EC_WAITINFINITE);
#endif /* !RTAI && !XENOMAI*/

        PERF_JOB_END(PERF_CycleTime);
        PERF_JOB_START(PERF_CycleTime);

        /* process all received frames (read new input values) */
        PERF_JOB_START(JOB_ProcessAllRxFrames);
        dwRes = ecatExecJob(eUsrJob_ProcessAllRxFrames, &bPrevCycProcessed);
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes && EC_E_LINK_DISCONNECTED != dwRes)
        {
            LogError("ERROR: ecatExecJob( eUsrJob_ProcessAllRxFrames): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_ProcessAllRxFrames);

        if (EC_E_NOERROR == dwRes)
        {
            if (!bPrevCycProcessed)
            {
                /* it is not reasonable, that more than 5 continuous frames are lost */
                nOverloadCounter += 10;
                if (nOverloadCounter >= 50)
                {
                    LogError( "Error: System overload: Cycle time too short or huge jitter!" );
                }
                else
                {
                    LogError( "eUsrJob_ProcessAllRxFrames - not all previously sent frames are received/processed (frame loss)!" );
                }
            }
            else
            {
                /* everything o.k.? If yes, decrement overload counter */
                if (nOverloadCounter > 0)    nOverloadCounter--;
            }
        }
        /* handle DCM logging */
#ifdef DCM_ENABLE_LOGFILE
        PERF_JOB_START(PERF_DCM_Logfile);
        {
            EC_T_CHAR* pszLog = EC_NULL;

            ecatDcmGetLog(&pszLog);
            if (EC_NULL != pszLog)
            {
                LogDcm(pszLog);
            }
        }
        PERF_JOB_END(PERF_DCM_Logfile);
#endif

        /*****************************************************/
        /* Demo code: Remove/change this in your application: Working process data cyclic call */
        /*****************************************************/
        PERF_JOB_START(PERF_myAppWorkpd);
        myAppWorkpd(pDemoThreadParam->pLogInst, pDemoThreadParam->pNotInst->Verbose(), ecatGetProcessImageInputPtr(), ecatGetProcessImageOutputPtr());
        PERF_JOB_END(PERF_myAppWorkpd);

        /* write output values of current cycle, by sending all cyclic frames */
        PERF_JOB_START(JOB_SendAllCycFrames);
        dwRes = ecatExecJob( eUsrJob_SendAllCycFrames, EC_NULL );
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes && EC_E_LINK_DISCONNECTED != dwRes)
        {
            LogError("ecatExecJob( eUsrJob_SendAllCycFrames,    EC_NULL ): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_SendAllCycFrames);

        /* remove this code when using licensed version */
        if (EC_E_EVAL_EXPIRED == dwRes )
        {
            bRun = EC_FALSE;        /* set shutdown flag */
        }

        /* Execute some administrative jobs. No bus traffic is performed by this function */
        PERF_JOB_START(JOB_MasterTimer);
        dwRes = ecatExecJob(eUsrJob_MasterTimer, EC_NULL);
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes)
        {
            LogError("ecatExecJob(eUsrJob_MasterTimer, EC_NULL): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_MasterTimer);

        /* send queued acyclic EtherCAT frames */
        PERF_JOB_START(JOB_SendAcycFrames);
        dwRes = ecatExecJob(eUsrJob_SendAcycFrames, EC_NULL);
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes && EC_E_LINK_DISCONNECTED != dwRes)
        {
            LogError("ecatExecJob(eUsrJob_SendAcycFrames, EC_NULL): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_SendAcycFrames);

#if !(defined NO_OS)
    } while (!pDemoThreadParam->bJobThreadShutdown);

    PERF_MEASURE_JOBS_SHOW();

    pDemoThreadParam->bJobThreadRunning = EC_FALSE;
#else
    /* in case of NO_OS the job task function is called cyclically within the timer ISR */
    }